

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-naming.h
# Opt level: O2

void wabt::RenameAll(Module *module)

{
  initializer_list<wabt::string_view> __l;
  allocator_type local_142;
  less<wabt::string_view> local_141;
  set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_> filter;
  string_view local_110;
  char *local_100;
  undefined8 local_f8;
  char *local_f0;
  undefined8 local_e8;
  char *local_e0;
  undefined8 local_d8;
  char *local_d0;
  undefined8 local_c8;
  char *local_c0;
  undefined8 local_b8;
  char *local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined8 local_98;
  char *local_90;
  undefined8 local_88;
  char *local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  char *local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  
  local_110.data_ = "const";
  local_110.size_ = 5;
  local_100 = "std";
  local_f8 = 3;
  local_f0 = "allocator";
  local_e8 = 9;
  local_e0 = "char";
  local_d8 = 4;
  local_d0 = "basic";
  local_c8 = 5;
  local_c0 = "traits";
  local_b8 = 6;
  local_b0 = "wchar";
  local_a8 = 5;
  local_a0 = "t";
  local_98 = 1;
  local_90 = "void";
  local_88 = 4;
  local_80 = "int";
  local_78 = 3;
  local_70 = "unsigned";
  local_68 = 8;
  local_60 = "2";
  local_58 = 1;
  local_50 = "cxxabiv1";
  local_48 = 8;
  local_40 = "short";
  local_38 = 5;
  local_30 = "4096ul";
  local_28 = 6;
  __l._M_len = 0xf;
  __l._M_array = &local_110;
  std::set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>::set
            ((set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)&filter._M_t,__l,&local_141,&local_142);
  RenameToIdentifiers<wabt::Func>
            (&module->funcs,&module->func_bindings,
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)&filter._M_t);
  RenameToIdentifiers<wabt::Global>
            (&module->globals,&module->global_bindings,
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)0x0);
  RenameToIdentifiers<wabt::Table>
            (&module->tables,&module->table_bindings,
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)0x0);
  RenameToIdentifiers<wabt::Event>
            (&module->events,&module->event_bindings,
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)0x0);
  RenameToIdentifiers<wabt::Export>
            (&module->exports,&module->export_bindings,
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)0x0);
  RenameToIdentifiers<wabt::TypeEntry>
            (&module->types,&module->type_bindings,
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)0x0);
  RenameToIdentifiers<wabt::Memory>
            (&module->memories,&module->memory_bindings,
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)0x0);
  RenameToIdentifiers<wabt::DataSegment>
            (&module->data_segments,&module->data_segment_bindings,
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)0x0);
  RenameToIdentifiers<wabt::ElemSegment>
            (&module->elem_segments,&module->elem_segment_bindings,
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)0x0);
  RenameToContents(&module->data_segments,&module->data_segment_bindings);
  std::
  _Rb_tree<wabt::string_view,_wabt::string_view,_std::_Identity<wabt::string_view>,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
  ::~_Rb_tree(&filter._M_t);
  return;
}

Assistant:

void RenameAll(Module& module) {
  // We also filter common C++ keywords/STL idents that make for huge
  // identifiers.
  // FIXME: this can obviously give bad results if the input is not C++..
  std::set<string_view> filter = {
    { "const" },
    { "std" },
    { "allocator" },
    { "char" },
    { "basic" },
    { "traits" },
    { "wchar" },
    { "t" },
    { "void" },
    { "int" },
    { "unsigned" },
    { "2" },
    { "cxxabiv1" },
    { "short" },
    { "4096ul" },
  };
  RenameToIdentifiers(module.funcs, module.func_bindings, &filter);
  // Also do this for some other kinds of names, but without the keyword
  // substitution.
  RenameToIdentifiers(module.globals, module.global_bindings, nullptr);
  RenameToIdentifiers(module.tables, module.table_bindings, nullptr);
  RenameToIdentifiers(module.events, module.event_bindings, nullptr);
  RenameToIdentifiers(module.exports, module.export_bindings, nullptr);
  RenameToIdentifiers(module.types, module.type_bindings, nullptr);
  RenameToIdentifiers(module.memories, module.memory_bindings, nullptr);
  RenameToIdentifiers(module.data_segments, module.data_segment_bindings,
                      nullptr);
  RenameToIdentifiers(module.elem_segments, module.elem_segment_bindings,
                      nullptr);
  // Special purpose naming for data segments.
  RenameToContents(module.data_segments, module.data_segment_bindings);
}